

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtherr.c
# Opt level: O2

int mtherr(char *name,int code)

{
  ulong uVar1;
  
  printf("\n%s ",name);
  uVar1 = (ulong)(uint)code;
  if (code - 7U < 0xfffffffa) {
    uVar1 = 0;
  }
  merror = code;
  printf("%s error\n",ermsg_rel + *(int *)(ermsg_rel + uVar1 * 4));
  return 0;
}

Assistant:

int mtherr( name, code )
char *name;
int code;
{

/* Display string passed by calling program,
 * which is supposed to be the name of the
 * function in which the error occurred:
 */
printf( "\n%s ", name );

/* Set global error message word */
merror = code;

/* Display error message defined
 * by the code argument.
 */
if( (code <= 0) || (code >= 7) )
	code = 0;
printf( "%s error\n", ermsg[code] );

/* Return to calling
 * program
 */
return( 0 );
}